

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningShaderTests.cpp
# Opt level: O0

void deqp::gles3::Stress::anon_unknown_1::genPositions
               (RenderTarget *renderTarget,int numPoints,Vec2 *positions)

{
  NotSupportedError *this;
  float fVar1;
  Vector<float,_2> local_7c;
  float local_74;
  float local_70;
  float yf;
  float xf;
  int yi;
  int xi;
  int pointNdx;
  allocator<char> local_49;
  string local_48;
  int local_28;
  int local_24;
  int height;
  int width;
  Vec2 *positions_local;
  RenderTarget *pRStack_10;
  int numPoints_local;
  RenderTarget *renderTarget_local;
  
  _height = positions;
  positions_local._4_4_ = numPoints;
  pRStack_10 = renderTarget;
  local_24 = tcu::RenderTarget::getWidth(renderTarget);
  local_28 = tcu::RenderTarget::getHeight(pRStack_10);
  if (local_24 * local_28 < positions_local._4_4_) {
    xi._3_1_ = 1;
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Too small viewport to fit all test points",&local_49);
    tcu::NotSupportedError::NotSupportedError(this,&local_48);
    xi._3_1_ = 0;
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  for (yi = 0; yi < positions_local._4_4_; yi = yi + 1) {
    xf = (float)(yi % local_24);
    yf = (float)(yi / local_28);
    fVar1 = ((float)(int)xf + 0.5) / (float)local_24;
    local_70 = fVar1 + fVar1 + -1.0;
    fVar1 = ((float)(int)yf + 0.5) / (float)local_28;
    local_74 = fVar1 + fVar1 + -1.0;
    tcu::Vector<float,_2>::Vector(&local_7c,local_70,local_74);
    *&_height[yi].m_data = local_7c.m_data;
  }
  return;
}

Assistant:

void genPositions (const tcu::RenderTarget& renderTarget, int numPoints, Vec2* positions)
{
	const int	width		= renderTarget.getWidth();
	const int	height		= renderTarget.getHeight();

	if (width*height < numPoints)
		throw tcu::NotSupportedError("Too small viewport to fit all test points");

	for (int pointNdx = 0; pointNdx < numPoints; pointNdx++)
	{
		const int		xi		= pointNdx % width;
		const int		yi		= pointNdx / height;
		const float		xf		= 2.0f * ((float(xi) + 0.5f) / float(width)) - 1.0f;
		const float		yf		= 2.0f * ((float(yi) + 0.5f) / float(height)) - 1.0f;

		positions[pointNdx] = Vec2(xf, yf);
	}
}